

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize_unittest.cc
# Opt level: O2

int GetStackConsumption(char *alt_stack)

{
  bool bVar1;
  uint uVar2;
  int i;
  uint uVar3;
  long lVar4;
  int local_14 [2];
  int x;
  
  bVar1 = StackGrowsDown(local_14);
  if (bVar1) {
    for (lVar4 = -0x1fa0; uVar2 = 0xffffffff, lVar4 != 0; lVar4 = lVar4 + 1) {
      if (alt_stack[lVar4 + 0x1fa0] != 'U') {
        return -(int)lVar4;
      }
    }
  }
  else {
    for (uVar3 = 0x1f9f;
        (uVar2 = 0xffffffff, -1 < (int)uVar3 && (uVar2 = uVar3, alt_stack[uVar3] == 'U'));
        uVar3 = uVar3 - 1) {
    }
  }
  return uVar2;
}

Assistant:

static int GetStackConsumption(const char* alt_stack) {
  int x;
  if (StackGrowsDown(&x)) {
    for (int i = 0; i < kAlternateStackSize; i++) {
      if (alt_stack[i] != kAlternateStackFillValue) {
        return (kAlternateStackSize - i);
      }
    }
  } else {
    for (int i = (kAlternateStackSize - 1); i >= 0; i--) {
      if (alt_stack[i] != kAlternateStackFillValue) {
        return i;
      }
    }
  }
  return -1;
}